

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O1

HighsInt Highs_getIntOptionValues
                   (void *highs,char *option,HighsInt *current_value,HighsInt *min_value,
                   HighsInt *max_value,HighsInt *default_value)

{
  HighsStatus HVar1;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,option,&local_51);
  HVar1 = Highs::getIntOptionValues
                    ((Highs *)highs,&local_50,current_value,min_value,max_value,default_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return HVar1;
}

Assistant:

HighsInt Highs_getIntOptionValues(const void* highs, const char* option,
                                  HighsInt* current_value, HighsInt* min_value,
                                  HighsInt* max_value,
                                  HighsInt* default_value) {
  return (HighsInt)((Highs*)highs)
      ->getIntOptionValues(std::string(option), current_value, min_value,
                           max_value, default_value);
}